

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::InputScalar(char *label,ImGuiDataType data_type,void *p_data,void *p_step,
                       void *p_step_fast,char *format,ImGuiInputTextFlags flags)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  void *pvVar3;
  bool bVar4;
  bool bVar5;
  char *text_end;
  void *pvVar6;
  uint flags_00;
  float fVar7;
  float fVar8;
  float fVar9;
  char buf [64];
  ImVec2 local_90;
  ImVec2 local_88;
  void *local_80;
  char local_78 [72];
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (pIVar1->SkipItems == false) {
    if (format == (char *)0x0) {
      format = GDataTypeInfo[data_type].PrintFmt;
    }
    local_80 = p_step_fast;
    DataTypeFormatString(local_78,0x40,data_type,p_data,format);
    flags_00 = (uint)((flags & 0x20002U) == 0) | flags | 0x8000010;
    if (p_step == (void *)0x0) {
      local_90.x = 0.0;
      local_90.y = 0.0;
      bVar4 = InputTextEx(label,(char *)0x0,local_78,0x40,&local_90,flags_00,
                          (ImGuiInputTextCallback)0x0,(void *)0x0);
      if (!bVar4) {
        return false;
      }
      bVar4 = DataTypeApplyFromText(local_78,data_type,p_data,format);
      if (!bVar4) goto LAB_00162c14;
    }
    else {
      fVar7 = GetFrameHeight();
      BeginGroup();
      PushID(label);
      fVar8 = CalcItemWidth();
      fVar9 = (pIVar2->Style).ItemInnerSpacing.x + fVar7;
      fVar8 = fVar8 - (fVar9 + fVar9);
      fVar9 = 1.0;
      if (1.0 <= fVar8) {
        fVar9 = fVar8;
      }
      SetNextItemWidth(fVar9);
      local_90.x = 0.0;
      local_90.y = 0.0;
      bVar5 = false;
      bVar4 = InputTextEx("",(char *)0x0,local_78,0x40,&local_90,flags_00,
                          (ImGuiInputTextCallback)0x0,(void *)0x0);
      if (bVar4) {
        bVar5 = DataTypeApplyFromText(local_78,data_type,p_data,format);
      }
      pvVar3 = local_80;
      local_88 = (pIVar2->Style).FramePadding;
      (pIVar2->Style).FramePadding.x = local_88.y;
      if (((uint)flags >> 0xe & 1) != 0) {
        BeginDisabled(true);
      }
      SameLine(0.0,(pIVar2->Style).ItemInnerSpacing.x);
      local_90.y = fVar7;
      local_90.x = fVar7;
      bVar4 = ButtonEx("-",&local_90,0x2400);
      if (bVar4) {
        pvVar6 = p_step;
        if ((pIVar2->IO).KeyCtrl != false) {
          pvVar6 = pvVar3;
        }
        if (pvVar3 == (void *)0x0) {
          pvVar6 = p_step;
        }
        DataTypeApplyOp(data_type,0x2d,p_data,p_data,pvVar6);
        bVar5 = true;
      }
      SameLine(0.0,(pIVar2->Style).ItemInnerSpacing.x);
      bVar4 = ButtonEx("+",&local_90,0x2400);
      if (bVar4) {
        pvVar6 = p_step;
        if ((pIVar2->IO).KeyCtrl != false) {
          pvVar6 = pvVar3;
        }
        if (pvVar3 == (void *)0x0) {
          pvVar6 = p_step;
        }
        DataTypeApplyOp(data_type,0x2b,p_data,p_data,pvVar6);
        bVar5 = true;
      }
      if (((uint)flags >> 0xe & 1) != 0) {
        EndDisabled();
      }
      text_end = FindRenderedTextEnd(label,(char *)0x0);
      if (text_end != label) {
        SameLine(0.0,(pIVar2->Style).ItemInnerSpacing.x);
        TextEx(label,text_end,0);
      }
      (pIVar2->Style).FramePadding = local_88;
      PopID();
      EndGroup();
      if (bVar5 == false) goto LAB_00162c14;
    }
    MarkItemEdited((pIVar2->LastItemData).ID);
    bVar4 = true;
  }
  else {
LAB_00162c14:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool ImGui::InputScalar(const char* label, ImGuiDataType data_type, void* p_data, const void* p_step, const void* p_step_fast, const char* format, ImGuiInputTextFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;

    if (format == NULL)
        format = DataTypeGetInfo(data_type)->PrintFmt;

    char buf[64];
    DataTypeFormatString(buf, IM_ARRAYSIZE(buf), data_type, p_data, format);

    bool value_changed = false;
    if ((flags & (ImGuiInputTextFlags_CharsHexadecimal | ImGuiInputTextFlags_CharsScientific)) == 0)
        flags |= ImGuiInputTextFlags_CharsDecimal;
    flags |= ImGuiInputTextFlags_AutoSelectAll;
    flags |= ImGuiInputTextFlags_NoMarkEdited;  // We call MarkItemEdited() ourselves by comparing the actual data rather than the string.

    if (p_step != NULL)
    {
        const float button_size = GetFrameHeight();

        BeginGroup(); // The only purpose of the group here is to allow the caller to query item data e.g. IsItemActive()
        PushID(label);
        SetNextItemWidth(ImMax(1.0f, CalcItemWidth() - (button_size + style.ItemInnerSpacing.x) * 2));
        if (InputText("", buf, IM_ARRAYSIZE(buf), flags)) // PushId(label) + "" gives us the expected ID from outside point of view
            value_changed = DataTypeApplyFromText(buf, data_type, p_data, format);

        // Step buttons
        const ImVec2 backup_frame_padding = style.FramePadding;
        style.FramePadding.x = style.FramePadding.y;
        ImGuiButtonFlags button_flags = ImGuiButtonFlags_Repeat | ImGuiButtonFlags_DontClosePopups;
        if (flags & ImGuiInputTextFlags_ReadOnly)
            BeginDisabled();
        SameLine(0, style.ItemInnerSpacing.x);
        if (ButtonEx("-", ImVec2(button_size, button_size), button_flags))
        {
            DataTypeApplyOp(data_type, '-', p_data, p_data, g.IO.KeyCtrl && p_step_fast ? p_step_fast : p_step);
            value_changed = true;
        }
        SameLine(0, style.ItemInnerSpacing.x);
        if (ButtonEx("+", ImVec2(button_size, button_size), button_flags))
        {
            DataTypeApplyOp(data_type, '+', p_data, p_data, g.IO.KeyCtrl && p_step_fast ? p_step_fast : p_step);
            value_changed = true;
        }
        if (flags & ImGuiInputTextFlags_ReadOnly)
            EndDisabled();

        const char* label_end = FindRenderedTextEnd(label);
        if (label != label_end)
        {
            SameLine(0, style.ItemInnerSpacing.x);
            TextEx(label, label_end);
        }
        style.FramePadding = backup_frame_padding;

        PopID();
        EndGroup();
    }
    else
    {
        if (InputText(label, buf, IM_ARRAYSIZE(buf), flags))
            value_changed = DataTypeApplyFromText(buf, data_type, p_data, format);
    }
    if (value_changed)
        MarkItemEdited(g.LastItemData.ID);

    return value_changed;
}